

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand_service.hpp
# Opt level: O0

void __thiscall
asio::detail::strand_service::dispatch<std::function<void()>>
          (strand_service *this,implementation_type *impl,function<void_()> *handler)

{
  undefined1 uVar1;
  uchar *puVar2;
  completion_handler<std::function<void_()>_> *base;
  long in_RDI;
  on_dispatch_exit on_exit;
  context ctx;
  operation *o;
  bool dispatch_immediately;
  ptr p;
  fenced_block b;
  strand_impl *in_stack_ffffffffffffff38;
  completion_handler<std::function<void_()>_> *in_stack_ffffffffffffff40;
  context *this_00;
  operation *in_stack_ffffffffffffff48;
  function<void_()> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  completion_handler<std::function<void_()>_> *this_01;
  size_t in_stack_ffffffffffffff98;
  error_code *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  
  puVar2 = call_stack<asio::detail::strand_service::strand_impl,_unsigned_char>::contains
                     (in_stack_ffffffffffffff38);
  if (puVar2 == (uchar *)0x0) {
    base = completion_handler<std::function<void_()>_>::ptr::allocate(in_stack_ffffffffffffff50);
    completion_handler<std::function<void_()>_>::completion_handler
              (in_stack_ffffffffffffff40,(function<void_()> *)in_stack_ffffffffffffff38);
    this_01 = base;
    uVar1 = do_dispatch((strand_service *)
                        CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                        (implementation_type *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if ((bool)uVar1) {
      call_stack<asio::detail::strand_service::strand_impl,_unsigned_char>::context::context
                ((context *)this_01,(strand_impl *)CONCAT17(uVar1,in_stack_ffffffffffffff58));
      this_00 = *(context **)(in_RDI + 0x28);
      std::error_code::error_code((error_code *)this_00);
      completion_handler<std::function<void_()>_>::do_complete
                ((void *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),&base->super_operation,
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      on_dispatch_exit::~on_dispatch_exit((on_dispatch_exit *)this_00);
      call_stack<asio::detail::strand_service::strand_impl,_unsigned_char>::context::~context
                (this_00);
    }
    completion_handler<std::function<void_()>_>::ptr::~ptr((ptr *)0x2d01b3);
  }
  else {
    std_fenced_block::std_fenced_block
              ((std_fenced_block *)in_stack_ffffffffffffff48,
               (full_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    asio_handler_invoke_helpers::invoke<std::function<void()>,std::function<void()>>
              ((function<void_()> *)in_stack_ffffffffffffff40,
               (function<void_()> *)in_stack_ffffffffffffff38);
    std_fenced_block::~std_fenced_block((std_fenced_block *)in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

void strand_service::dispatch(strand_service::implementation_type& impl,
    Handler& handler)
{
  // If we are already in the strand then the handler can run immediately.
  if (call_stack<strand_impl>::contains(impl))
  {
    fenced_block b(fenced_block::full);
    asio_handler_invoke_helpers::invoke(handler, handler);
    return;
  }

  // Allocate and construct an operation to wrap the handler.
  typedef completion_handler<Handler> op;
  typename op::ptr p = { asio::detail::addressof(handler),
    op::ptr::allocate(handler), 0 };
  p.p = new (p.v) op(handler);

  ASIO_HANDLER_CREATION((this->context(),
        *p.p, "strand", impl, 0, "dispatch"));

  bool dispatch_immediately = do_dispatch(impl, p.p);
  operation* o = p.p;
  p.v = p.p = 0;

  if (dispatch_immediately)
  {
    // Indicate that this strand is executing on the current thread.
    call_stack<strand_impl>::context ctx(impl);

    // Ensure the next handler, if any, is scheduled on block exit.
    on_dispatch_exit on_exit = { &io_context_, impl };
    (void)on_exit;

    completion_handler<Handler>::do_complete(
        &io_context_, o, asio::error_code(), 0);
  }
}